

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O2

SslTcpSocket * __thiscall
SslTcpServerImpl::MakeClientConnection(SslTcpServerImpl *this,int32_t *fSock)

{
  BaseSocket *pBVar1;
  SslConnection *pSVar2;
  undefined8 __p;
  BaseSocket *this_00;
  BaseSocketImpl *pBVar3;
  SslTcpSocketImpl *pSVar4;
  TcpServer *pTVar5;
  void *pVoid;
  SslTcpSocketImpl *pSslTcpSocketImpl;
  _Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false> local_a8;
  _Any_data local_a0;
  _Alloc_hider local_90;
  _Bind<void_(BaseSocketImpl::*(SslTcpSocketImpl_*))()> local_40;
  
  if ((this->m_SslCtx).
      super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->m_SslCtx).
      super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    OpenSSLWrapper::SslServerContext::SslServerContext((SslServerContext *)&local_a0);
    std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
    ::emplace_back<OpenSSLWrapper::SslServerContext>(&this->m_SslCtx,(SslServerContext *)&local_a0);
    OpenSSLWrapper::SslServerContext::~SslServerContext((SslServerContext *)&local_a0);
  }
  std::make_unique<SslTcpSocket>();
  local_a8._M_head_impl = (SslConnection *)local_a0._M_unused._0_8_;
  pSVar4 = (SslTcpSocketImpl *)0x0;
  this_00 = (BaseSocket *)
            __dynamic_cast(local_a0._M_unused._M_object,&BaseSocket::typeinfo,
                           &SslTcpSocket::typeinfo,0);
  pBVar3 = BaseSocket::GetImpl(this_00);
  if (pBVar3 != (BaseSocketImpl *)0x0) {
    pSVar4 = (SslTcpSocketImpl *)
             __dynamic_cast(pBVar3,&BaseSocketImpl::typeinfo,&SslTcpSocketImpl::typeinfo,0);
  }
  pSslTcpSocketImpl = pSVar4;
  std::make_unique<OpenSSLWrapper::SslConnection,OpenSSLWrapper::SslServerContext&>
            ((SslServerContext *)&local_a0);
  __p = local_a0._M_unused._0_8_;
  local_a0._M_unused._M_object = (void *)0x0;
  std::
  __uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
  ::reset((__uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           *)&pSVar4->m_pSslCon,(pointer)__p);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  ~unique_ptr((unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               *)&local_a0);
  pSVar4 = pSslTcpSocketImpl;
  (pSslTcpSocketImpl->super_TcpSocketImpl).super_BaseSocketImpl.m_fSock = *fSock;
  LOCK();
  (pSslTcpSocketImpl->super_TcpSocketImpl).super_BaseSocketImpl.m_iShutDownState.
  super___atomic_base<unsigned_char>._M_i = '\a';
  UNLOCK();
  pBVar1 = (this->super_TcpServerImpl).super_BaseSocketImpl.m_pBkRef;
  if (pBVar1 == (BaseSocket *)0x0) {
    pTVar5 = (TcpServer *)0x0;
  }
  else {
    pTVar5 = (TcpServer *)__dynamic_cast(pBVar1,&BaseSocket::typeinfo,&SslTcpServer::typeinfo,0);
  }
  (pSVar4->super_TcpSocketImpl).m_pRefServSocket = pTVar5;
  local_a0._M_unused._M_object = TcpSocketImpl::WriteThread;
  local_a0._8_8_ = (SSL_CTX *)0x0;
  std::thread::thread<void(TcpSocketImpl::*)(),SslTcpSocketImpl*&,void>
            ((thread *)&local_40,(type *)local_a0._M_pod_data,&pSslTcpSocketImpl);
  std::thread::operator=
            (&(pSslTcpSocketImpl->super_TcpSocketImpl).super_BaseSocketImpl.m_thWrite,
             (thread *)&local_40);
  std::thread::~thread((thread *)&local_40);
  pSVar2 = (pSslTcpSocketImpl->m_pSslCon)._M_t.
           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ._M_t.
           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
  local_40._M_f = 0x11;
  local_40._8_8_ = 0;
  local_40._M_bound_args.super__Tuple_impl<0UL,_SslTcpSocketImpl_*>.
  super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_SslTcpSocketImpl_*>)(_Tuple_impl<0UL,_SslTcpSocketImpl_*>)pSslTcpSocketImpl
  ;
  std::function<void()>::function<std::_Bind<void(BaseSocketImpl::*(SslTcpSocketImpl*))()>,void>
            ((function<void()> *)&local_a0,&local_40);
  OpenSSLWrapper::SslConnection::SetErrorCb(pSVar2,(function<void_()> *)&local_a0);
  std::_Function_base::~_Function_base((_Function_base *)&local_a0);
  pVoid = (void *)0x0;
  OpenSSLWrapper::SslConnection::SetUserData
            ((pSslTcpSocketImpl->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,0,
             SslTcpSocketImpl::fnForwarder_abi_cxx11_);
  pSVar2 = (pSslTcpSocketImpl->m_pSslCon)._M_t.
           super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           ._M_t.
           super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
           .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl;
  pBVar3 = BaseSocket::GetImpl(this_00);
  if (pBVar3 != (BaseSocketImpl *)0x0) {
    pVoid = (void *)__dynamic_cast(pBVar3,&BaseSocketImpl::typeinfo,&SslTcpSocketImpl::typeinfo,0);
  }
  OpenSSLWrapper::SslConnection::SetUserData(pSVar2,1,pVoid);
  local_a0._M_unused._M_object = SslTcpSocketImpl::DatenEncode;
  local_a0._8_8_ = (SSL_CTX *)0x0;
  local_90._M_p = (pointer)pSslTcpSocketImpl;
  std::function<int(unsigned_char_const*,unsigned_long)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long)> *)
             &(pSslTcpSocketImpl->super_TcpSocketImpl).m_fnSslEncode,
             (_Bind<int_(SslTcpSocketImpl::*(SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_unsigned_char_*,_unsigned_long)>
              *)&local_a0);
  local_a0._M_unused._M_object = SslTcpSocketImpl::DatenDecode;
  local_a0._8_8_ = (SSL_CTX *)0x0;
  local_90._M_p = (pointer)pSslTcpSocketImpl;
  std::function<int(unsigned_char_const*,unsigned_long,bool&)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long,bool&)> *)
             &(pSslTcpSocketImpl->super_TcpSocketImpl).m_fnSslDecode,
             (_Bind<int_(SslTcpSocketImpl::*(SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_unsigned_char_*,_unsigned_long,_bool_&)>
              *)&local_a0);
  OpenSSLWrapper::SslConnection::SSLSetAcceptState
            ((pSslTcpSocketImpl->m_pSslCon)._M_t.
             super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ._M_t.
             super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
  (*(pSslTcpSocketImpl->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl[0xe])
            (pSslTcpSocketImpl,fSock);
  TcpSocketImpl::GetConnectionInfo(&pSslTcpSocketImpl->super_TcpSocketImpl);
  std::mutex::lock(&BaseSocketImpl::s_mxClientSocket);
  std::
  deque<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>,std::allocator<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>>
  ::emplace_back<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>
            ((deque<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>,std::allocator<std::unique_ptr<BaseSocket,std::default_delete<BaseSocket>>>>
              *)&BaseSocketImpl::s_lstClientSocket,
             (unique_ptr<BaseSocket,_std::default_delete<BaseSocket>_> *)&local_a8);
  pthread_mutex_unlock((pthread_mutex_t *)&BaseSocketImpl::s_mxClientSocket);
  if (local_a8._M_head_impl != (pointer)0x0) {
    (**(code **)((local_a8._M_head_impl)->m_ssl + 8))();
  }
  return (SslTcpSocket *)this_00;
}

Assistant:

SslTcpSocket* SslTcpServerImpl::MakeClientConnection(const SOCKET& fSock)
{
    if (m_SslCtx.size() == 0)
        m_SslCtx.emplace_back(SslServerContext());

    unique_ptr<BaseSocket> pSslTcpSocket = make_unique<SslTcpSocket>();
    SslTcpSocket* pSslTcpSock = dynamic_cast<SslTcpSocket*>(pSslTcpSocket.get());
    SslTcpSocketImpl* pSslTcpSocketImpl = dynamic_cast<SslTcpSocketImpl*>(pSslTcpSock->GetImpl());

    try
    {
        pSslTcpSocketImpl->m_pSslCon = make_unique<SslConnection>(m_SslCtx.front());

        pSslTcpSocketImpl->m_fSock = fSock;
        pSslTcpSocketImpl->m_iShutDownState = 7;
        pSslTcpSocketImpl->m_pRefServSocket = dynamic_cast<SslTcpServer*>(m_pBkRef);
        pSslTcpSocketImpl->m_thWrite = thread(&TcpSocketImpl::WriteThread, pSslTcpSocketImpl);

        pSslTcpSocketImpl->m_pSslCon->SetErrorCb(function<void()>(bind(&BaseSocketImpl::Close, pSslTcpSocketImpl)));
        pSslTcpSocketImpl->m_pSslCon->SetUserData(0, reinterpret_cast<void*>(&SslTcpSocketImpl::fnForwarder));
        pSslTcpSocketImpl->m_pSslCon->SetUserData(1, dynamic_cast<SslTcpSocketImpl*>(pSslTcpSock->GetImpl()));
        pSslTcpSocketImpl->m_fnSslEncode = bind(&SslTcpSocketImpl::DatenEncode, pSslTcpSocketImpl, _1, _2);
        pSslTcpSocketImpl->m_fnSslDecode = bind(&SslTcpSocketImpl::DatenDecode, pSslTcpSocketImpl, _1, _2, _3);

        pSslTcpSocketImpl->m_pSslCon->SSLSetAcceptState();

        pSslTcpSocketImpl->SetSocketOption(fSock);
        pSslTcpSocketImpl->GetConnectionInfo();
    }

    catch (const int iErrNo)
    {
        pSslTcpSocketImpl->SetErrorNo(iErrNo);
    }

    lock_guard<mutex> lock(s_mxClientSocket);
    s_lstClientSocket.push_back(move(pSslTcpSocket));

    return pSslTcpSock;
}